

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O0

void QGraphicsSceneBspTreeIndexPrivate::climbTree(QGraphicsItem *item,int *stackingOrder)

{
  iterator __last;
  bool bVar1;
  Int IVar2;
  iterator stackingOrder_00;
  long lVar3;
  qsizetype qVar4;
  QGraphicsItemPrivate *pQVar5;
  QGraphicsItem *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem *item_2;
  int i_1;
  QGraphicsItem *item_1;
  int i;
  QList<QGraphicsItem_*> childList;
  undefined4 in_stack_ffffffffffffff68;
  GraphicsItemFlag in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int iVar6;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  iterator in_stack_ffffffffffffff88;
  int local_64;
  int local_54;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_2c;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_28;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_24;
  QList<QGraphicsItem_*> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
            ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *)
             (in_RDI + 8));
  bVar1 = QList<QGraphicsItem_*>::isEmpty((QList<QGraphicsItem_*> *)0xa1e3e3);
  if (bVar1) {
    iVar6 = *(int *)&in_RSI->_vptr_QGraphicsItem;
    *(int *)&in_RSI->_vptr_QGraphicsItem = iVar6 + 1;
    pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RDI + 8));
    pQVar5->globalStackingOrder = iVar6;
  }
  else {
    local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.d.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
    local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
              ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *
               )(in_RDI + 8));
    QList<QGraphicsItem_*>::QList
              ((QList<QGraphicsItem_*> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (QList<QGraphicsItem_*> *)
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    stackingOrder_00 =
         QList<QGraphicsItem_*>::begin
                   ((QList<QGraphicsItem_*> *)
                    CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    QList<QGraphicsItem_*>::end
              ((QList<QGraphicsItem_*> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    __last.i._4_4_ = in_stack_ffffffffffffff84;
    __last.i._0_4_ = in_stack_ffffffffffffff80;
    std::sort<QList<QGraphicsItem*>::iterator,bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>
              (in_stack_ffffffffffffff88,__last,
               (_func_bool_QGraphicsItem_ptr_QGraphicsItem_ptr *)
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    local_54 = 0;
    while( true ) {
      lVar3 = (long)local_54;
      qVar4 = QList<QGraphicsItem_*>::size(&local_20);
      if (qVar4 <= lVar3) break;
      QList<QGraphicsItem_*>::at
                ((QList<QGraphicsItem_*> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      local_28.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
           (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
           QGraphicsItem::flags
                     ((QGraphicsItem *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                     );
      local_24.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
           (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
           QFlags<QGraphicsItem::GraphicsItemFlag>::operator&
                     ((QFlags<QGraphicsItem::GraphicsItemFlag> *)
                      CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      in_stack_ffffffffffffff6c);
      bVar1 = QFlags<QGraphicsItem::GraphicsItemFlag>::operator!
                        ((QFlags<QGraphicsItem::GraphicsItemFlag> *)&local_24);
      if (bVar1) {
        QList<QGraphicsItem_*>::at
                  ((QList<QGraphicsItem_*> *)
                   CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        climbTree(in_RSI,(int *)stackingOrder_00.i);
      }
      local_54 = local_54 + 1;
    }
    iVar6 = *(int *)&in_RSI->_vptr_QGraphicsItem;
    *(int *)&in_RSI->_vptr_QGraphicsItem = iVar6 + 1;
    pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RDI + 8));
    pQVar5->globalStackingOrder = iVar6;
    for (local_64 = 0; qVar4 = QList<QGraphicsItem_*>::size(&local_20), local_64 < qVar4;
        local_64 = local_64 + 1) {
      QList<QGraphicsItem_*>::at
                ((QList<QGraphicsItem_*> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      QGraphicsItem::flags
                ((QGraphicsItem *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      local_2c.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
           (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
           QFlags<QGraphicsItem::GraphicsItemFlag>::operator&
                     ((QFlags<QGraphicsItem::GraphicsItemFlag> *)
                      CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      in_stack_ffffffffffffff6c);
      IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_2c);
      if (IVar2 != 0) {
        QList<QGraphicsItem_*>::at
                  ((QList<QGraphicsItem_*> *)
                   CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        climbTree(in_RSI,(int *)stackingOrder_00.i);
      }
    }
    QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0xa1e5da);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsSceneBspTreeIndexPrivate::climbTree(QGraphicsItem *item, int *stackingOrder)
{
    if (!item->d_ptr->children.isEmpty()) {
        QList<QGraphicsItem *> childList = item->d_ptr->children;
        std::sort(childList.begin(), childList.end(), qt_closestLeaf);
        for (int i = 0; i < childList.size(); ++i) {
            QGraphicsItem *item = childList.at(i);
            if (!(item->flags() & QGraphicsItem::ItemStacksBehindParent))
                climbTree(childList.at(i), stackingOrder);
        }
        item->d_ptr->globalStackingOrder = (*stackingOrder)++;
        for (int i = 0; i < childList.size(); ++i) {
            QGraphicsItem *item = childList.at(i);
            if (item->flags() & QGraphicsItem::ItemStacksBehindParent)
                climbTree(childList.at(i), stackingOrder);
        }
    } else {
        item->d_ptr->globalStackingOrder = (*stackingOrder)++;
    }
}